

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_test.cc
# Opt level: O2

void __thiscall GraphTestRootNodes::~GraphTestRootNodes(GraphTestRootNodes *this)

{
  GraphTest::~GraphTest(&this->super_GraphTest);
  operator_delete(this,0x228);
  return;
}

Assistant:

TEST_F(GraphTest, RootNodes) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"build out1: cat in1\n"
"build mid1: cat in1\n"
"build out2: cat mid1\n"
"build out3 out4: cat mid1\n"));

  string err;
  vector<Node*> root_nodes = state_.RootNodes(&err);
  EXPECT_EQ(4u, root_nodes.size());
  for (size_t i = 0; i < root_nodes.size(); ++i) {
    string name = root_nodes[i]->path();
    EXPECT_EQ("out", name.substr(0, 3));
  }
}